

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

void __thiscall transaction_tests::tx_valid::test_method(tx_valid *this)

{
  pointer pcVar1;
  string strFlags;
  bool bVar2;
  readonly_property<bool> rVar3;
  _Rb_tree_color flags_00;
  uint uVar4;
  UniValue *pUVar5;
  UniValue *pUVar6;
  UniValue *pUVar7;
  string *psVar8;
  mapped_type *pmVar9;
  long lVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  uint64_t uVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  char *pcVar16;
  uint flags_01;
  size_t index;
  iterator in_R8;
  PrecomputedTransactionData *pPVar17;
  iterator pvVar18;
  iterator in_R9;
  string *psVar19;
  iterator pvVar20;
  RandomMixin<FastRandomContext> *this_00;
  size_t index_00;
  char *pcVar21;
  long in_FS_OFFSET;
  const_string file;
  string_view jsondata;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  string_view str;
  uint flags;
  DataStream stream;
  PrecomputedTransactionData txdata;
  TxValidationState state;
  CTransaction tx;
  string transaction;
  UniValue inputs;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  mapprevOutValues;
  map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  mapprevOutScriptPubKeys;
  string strTest;
  UniValue tests;
  undefined4 uVar22;
  undefined4 uVar23;
  check_type cVar25;
  RandomMixin<FastRandomContext> *pRVar24;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_01;
  size_t in_stack_fffffffffffff980;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  assertion_result local_638;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  assertion_result local_5f0;
  char *local_5d8;
  assertion_result local_5d0;
  _Base_ptr local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  uint local_58c;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 local_548 [16];
  undefined ***local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  DataStream local_4a8;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 local_3f8 [8];
  element_type *local_3f0;
  shared_count sStack_3e8;
  _Base_ptr local_3e0;
  _Rb_tree_node_base local_3c8;
  long *local_3a8 [2];
  long local_398 [2];
  undefined1 local_388 [16];
  sp_counted_base *local_378;
  char *pcStack_370;
  uint32_t local_368;
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_280;
  TxValidationState local_258;
  undefined1 local_208 [24];
  undefined1 auStack_1f0 [104];
  long *local_188;
  size_t local_180;
  long local_178 [2];
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  shared_count sStack_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<UniValue,_std::allocator<UniValue>_> local_128;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_110;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  local_e0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xc4;
  file.m_begin = (iterator)&local_408;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_418,msg);
  bVar2 = CheckMapFlagNames();
  local_208[0] = bVar2;
  local_208._8_4_ = 0;
  local_208._12_4_ = 0;
  local_208._16_4_ = 0;
  local_208._20_4_ = 0;
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_013d4c20;
  local_378 = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcStack_370 = "mapFlagNames is missing a script verification flag";
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_420 = "";
  pPVar17 = (PrecomputedTransactionData *)0x1;
  psVar19 = (string *)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)local_388,1,1,WARN,_cVar25,
             (size_t)&local_428,0xc4);
  boost::detail::shared_count::~shared_count((shared_count *)(local_208 + 0x10));
  jsondata._M_str =
       "[\n[\"The following are deserialized transactions which are valid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, excluded verifyFlags]\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"The following is 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is of particular interest because it contains an invalidly-encoded signature which OpenSSL accepts\"],\n[\"See http://r6.ca/blog/20111119T211504Z.html\"],\n[\"It is also the first OP_CHECKMULTISIG transaction in standard form\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e1060bc14e518db2b49aa43ad90ba26000000000490047304402203f16c6f40162ab686621ef3000b04e75418a0c0cb2d8aebeac894ae360ac1e780220ddc15ecdfc3507ac48e1681a33eb60996631bf6bf5bc0a0682c4db743ce7ca2b01ffffffff0140420f00000000001976a914660d4ef3a743e3e696ad990364e555c271ad504b88ac00000000\", \"DERSIG,LOW_S,STRICTENC\"],\n\n[\"The following is a tweaked form of 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is an OP_CHECKMULTISIG with an arbitrary extra byte stuffed into the signature at pos length - 2\"],\n[\"The dummy byte is fine however, so the NULLDUMMY flag should be happy\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e10..." /* TRUNCATED STRING LITERAL */
  ;
  jsondata._M_len = 0x14f90;
  read_json(&local_90,jsondata);
  if (local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.super_RandomMixin<FastRandomContext>
    ;
    this_01 = &vStack_280;
    index_00 = 0;
    pRVar24 = this_00;
    do {
      pUVar5 = ::UniValue::operator[](&local_90,index_00);
      ::UniValue::write_abi_cxx11_((UniValue *)&local_b0,(int)pUVar5,(void *)0x0,0);
      pUVar6 = ::UniValue::operator[](pUVar5,0);
      if (pUVar6->typ == VARR) {
        if ((((long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start == 0x108) &&
            (pUVar6 = ::UniValue::operator[](pUVar5,1), pUVar6->typ == VSTR)) &&
           (pUVar6 = ::UniValue::operator[](pUVar5,2), pUVar6->typ == VSTR)) {
          local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_e0._M_impl.super__Rb_tree_header._M_header;
          local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_110._M_impl.super__Rb_tree_header._M_header;
          local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_right =
               local_110._M_impl.super__Rb_tree_header._M_header._M_left;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
          pUVar6 = ::UniValue::operator[](pUVar5,0);
          pUVar6 = ::UniValue::get_array(pUVar6);
          local_168._0_4_ = pUVar6->typ;
          local_160._M_p = (pointer)&local_150;
          pcVar1 = (pUVar6->val)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,pcVar1,pcVar1 + (pUVar6->val)._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_140,&pUVar6->keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_128,&pUVar6->values);
          if (local_128.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
LAB_0066b2e6:
            pUVar6 = ::UniValue::operator[](pUVar5,1);
            psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
            local_188 = local_178;
            pcVar1 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_188,pcVar1,pcVar1 + psVar8->_M_string_length);
            hex_str._M_str = (char *)local_188;
            hex_str._M_len = local_180;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,hex_str);
            sp.m_size = local_388._8_8_ - local_388._0_8_;
            sp.m_data = (byte *)local_388._0_8_;
            DataStream::DataStream(&local_4a8,sp);
            if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
              operator_delete((void *)local_388._0_8_,(long)local_378 - local_388._0_8_);
            }
            CTransaction::CTransaction<DataStream>
                      ((CTransaction *)local_208,&::TX_WITH_WITNESS,&local_4a8);
            local_258.super_ValidationState<TxValidationResult>._0_8_ = (_func_int **)0x0;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)&local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                           field_2;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
            ;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity =
                 local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                 _M_allocated_capacity & 0xffffffffffffff00;
            local_258.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                 (pointer)&local_258.super_ValidationState<TxValidationResult>.m_debug_message.
                           field_2;
            local_258.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0
            ;
            local_258.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf
            [0] = '\0';
            local_4b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4b0 = "";
            local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_00.m_end = (iterator)0xf5;
            file_00.m_begin = (iterator)&local_4b8;
            msg_00.m_end = (iterator)psVar19;
            msg_00.m_begin = (iterator)pPVar17;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                       (size_t)&local_4c8,msg_00);
            rVar3.super_class_property<bool>.value =
                 (class_property<bool>)CheckTransaction((CTransaction *)local_208,&local_258);
            local_3f0 = (element_type *)0x0;
            sStack_3e8.pi_ = (sp_counted_base *)0x0;
            local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
            local_388._0_8_ = &PTR__lazy_ostream_013d3bb0;
            local_378 = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            pcStack_370 = (char *)&local_b0;
            local_4d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4d0 = "";
            pvVar18 = (iterator)0x1;
            pvVar20 = (iterator)0x1;
            local_3f8[0] = rVar3.super_class_property<bool>.value;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_3f8,(lazy_ostream *)local_388,1,1,WARN,
                       (check_type)pRVar24,(size_t)&local_4d8,0xf5);
            boost::detail::shared_count::~shared_count(&sStack_3e8);
            local_4e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4e0 = "";
            local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0xf6;
            file_01.m_begin = (iterator)&local_4e8;
            msg_01.m_end = pvVar20;
            msg_01.m_begin = pvVar18;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_4f8,msg_01);
            local_3f8[0] = (class_property<bool>)
                           (class_property<bool>)
                           (local_258.super_ValidationState<TxValidationResult>.m_mode == M_VALID);
            local_3f0 = (element_type *)0x0;
            sStack_3e8.pi_ = (sp_counted_base *)0x0;
            local_548._0_8_ = "state.IsValid()";
            local_548._8_8_ = "";
            local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
            local_388._0_8_ = &PTR__lazy_ostream_013d3df0;
            local_378 = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            pcStack_370 = local_548;
            local_508 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_500 = "";
            uVar22 = 0;
            uVar23 = 0;
            pvVar18 = (iterator)0x1;
            pvVar20 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_3f8,(lazy_ostream *)local_388,1,0,WARN,
                       (check_type)pRVar24,(size_t)&local_508,0xf6);
            boost::detail::shared_count::~shared_count(&sStack_3e8);
            PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>
                      ((PrecomputedTransactionData *)local_388,(CTransaction *)local_208);
            pUVar5 = ::UniValue::operator[](pUVar5,2);
            psVar19 = ::UniValue::get_str_abi_cxx11_(pUVar5);
            local_3a8[0] = local_398;
            pcVar1 = (psVar19->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3a8,pcVar1,pcVar1 + psVar19->_M_string_length);
            strFlags._M_dataplus._M_p._4_4_ = uVar23;
            strFlags._M_dataplus._M_p._0_4_ = uVar22;
            strFlags._M_string_length = (size_type)pRVar24;
            strFlags.field_2._M_allocated_capacity = (size_type)this_01;
            strFlags.field_2._8_8_ = in_stack_fffffffffffff980;
            flags_00 = ParseScriptFlags(strFlags);
            if (local_3a8[0] != local_398) {
              operator_delete(local_3a8[0],local_398[0] + 1);
            }
            flags_01 = ~flags_00;
            uVar4 = FillFlags(flags_01);
            if (uVar4 != flags_01) {
              local_518 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_510 = "";
              local_528 = &boost::unit_test::basic_cstring<char_const>::null;
              local_520 = &boost::unit_test::basic_cstring<char_const>::null;
              file_02.m_end = (iterator)0xfd;
              file_02.m_begin = (iterator)&local_518;
              msg_02.m_end = pvVar20;
              msg_02.m_begin = pvVar18;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                         (size_t)&local_528,msg_02);
              local_5d0._0_8_ = local_5d0._0_8_ & 0xffffffffffffff00;
              local_5d0.m_message.px = (element_type *)0x0;
              local_5d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_548._8_8_ = local_548._8_8_ & 0xffffffffffffff00;
              local_548._0_8_ = &PTR__lazy_ostream_013d8a70;
              local_538 = (undefined ***)boost::unit_test::lazy_ostream::inst;
              local_530 = "Bad test flags: ";
              local_3f0 = (element_type *)((ulong)local_3f0 & 0xffffffffffffff00);
              local_3f8 = (undefined1  [8])&PTR__lazy_ostream_013d8ab0;
              sStack_3e8.pi_ = (sp_counted_base *)local_548;
              local_3e0 = (_Base_ptr)&local_b0;
              local_558 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_550 = "";
              pvVar18 = (iterator)0x1;
              pvVar20 = (iterator)0x1;
              boost::test_tools::tt_detail::report_assertion
                        (&local_5d0,(lazy_ostream *)local_3f8,1,1,WARN,(check_type)pRVar24,
                         (size_t)&local_558,0xfd);
              boost::detail::shared_count::~shared_count(&local_5d0.m_message.pn);
            }
            local_568 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_560 = "";
            local_578 = &boost::unit_test::basic_cstring<char_const>::null;
            local_570 = &boost::unit_test::basic_cstring<char_const>::null;
            file_03.m_end = (iterator)0x101;
            file_03.m_begin = (iterator)&local_568;
            msg_03.m_end = pvVar20;
            msg_03.m_begin = pvVar18;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                       (size_t)&local_578,msg_03);
            bVar2 = CheckTxScripts((CTransaction *)local_208,
                                   (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                    *)&local_e0,
                                   (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                    *)&local_110,flags_01,(PrecomputedTransactionData *)local_388,
                                   (string *)&local_b0,true);
            local_5d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)bVar2;
            local_5d0.m_message.px = (element_type *)0x0;
            local_5d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_548._8_8_ = local_548._8_8_ & 0xffffffffffffff00;
            local_548._0_8_ = &PTR__lazy_ostream_013d3900;
            local_538 = (undefined ***)boost::unit_test::lazy_ostream::inst;
            local_530 = "Tx unexpectedly failed: ";
            local_3f0 = (element_type *)((ulong)local_3f0 & 0xffffffffffffff00);
            local_3f8 = (undefined1  [8])&PTR__lazy_ostream_013d8af0;
            sStack_3e8.pi_ = (sp_counted_base *)local_548;
            local_588 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_580 = "";
            pPVar17 = (PrecomputedTransactionData *)0x1;
            psVar19 = (string *)0x1;
            local_3e0 = (_Base_ptr)&local_b0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_5d0,(lazy_ostream *)local_3f8,1,1,WARN,(check_type)pRVar24,
                       (size_t)&local_588,0x101);
            boost::detail::shared_count::~shared_count(&local_5d0.m_message.pn);
            in_stack_fffffffffffff980 = index_00;
            for (p_Var14 = mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left;
                (_Rb_tree_header *)p_Var14 !=
                &mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
                p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14)) {
              local_58c = TrimFlags(~(p_Var14[2]._M_color | flags_00));
              pPVar17 = (PrecomputedTransactionData *)local_388;
              psVar19 = (string *)&local_b0;
              bVar2 = CheckTxScripts((CTransaction *)local_208,
                                     (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                      *)&local_e0,
                                     (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                      *)&local_110,local_58c,pPVar17,psVar19,true);
              if (!bVar2) {
                local_5a0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_598 = "";
                local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_04.m_end = (iterator)0x108;
                file_04.m_begin = (iterator)&local_5a0;
                msg_04.m_end = (iterator)psVar19;
                msg_04.m_begin = (iterator)pPVar17;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                           (size_t)&local_5b0,msg_04);
                local_5b8 = p_Var14 + 1;
                local_5d0.m_message.px =
                     (element_type *)((ulong)local_5d0.m_message.px & 0xffffffffffffff00);
                local_5d0._0_8_ = &PTR__lazy_ostream_013d8b30;
                local_5d0.m_message.pn.pi_ = (sp_counted_base *)&local_5f0;
                local_3c8._M_color._0_1_ = _S_red;
                local_3c8._M_parent = (_Base_ptr)0x0;
                local_3c8._M_left = (_Base_ptr)0x0;
                local_5f0.m_message.px =
                     (element_type *)((ulong)local_5f0.m_message.px & 0xffffffffffffff00);
                local_5f0._0_8_ = &PTR__lazy_ostream_013d6448;
                local_5f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_5d8 = "Tx unexpectedly failed with flag ";
                local_548._8_8_ = local_548._8_8_ & 0xffffffffffffff00;
                local_548._0_8_ = &PTR__lazy_ostream_013d8b70;
                local_538 = (undefined ***)&local_5d0;
                local_530 = " unset: ";
                local_3f0 = (element_type *)((ulong)local_3f0 & 0xffffffffffffff00);
                local_3f8 = (undefined1  [8])&PTR__lazy_ostream_013d8bb0;
                sStack_3e8.pi_ = (sp_counted_base *)local_548;
                local_3e0 = (_Base_ptr)&local_b0;
                local_600 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_5f8 = "";
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_3c8,(lazy_ostream *)local_3f8,1,1,WARN,
                           (check_type)pRVar24,(size_t)&local_600,0x108);
                boost::detail::shared_count::~shared_count((shared_count *)&local_3c8._M_left);
              }
              uVar13 = RandomMixin<FastRandomContext>::randbits
                                 (this_00,(int)mapFlagNames_abi_cxx11_._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count);
              local_58c = TrimFlags(~((_Rb_tree_color)uVar13 | flags_00));
              pPVar17 = (PrecomputedTransactionData *)local_388;
              psVar19 = (string *)&local_b0;
              bVar2 = CheckTxScripts((CTransaction *)local_208,
                                     (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                      *)&local_e0,
                                     (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                      *)&local_110,local_58c,pPVar17,psVar19,true);
              if (!bVar2) {
                local_610 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_608 = "";
                local_620 = &boost::unit_test::basic_cstring<char_const>::null;
                local_618 = &boost::unit_test::basic_cstring<char_const>::null;
                file_05.m_end = (iterator)0x10d;
                file_05.m_begin = (iterator)&local_610;
                msg_05.m_end = (iterator)psVar19;
                msg_05.m_begin = (iterator)pPVar17;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                           (size_t)&local_620,msg_05);
                local_638.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(class_property<bool>)0x0;
                local_638.m_message.px = (element_type *)0x0;
                local_638.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_5f0.m_message.px =
                     (element_type *)((ulong)local_5f0.m_message.px & 0xffffffffffffff00);
                local_5f0._0_8_ = &PTR__lazy_ostream_013d3698;
                local_5f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_5d8 = "Tx unexpectedly failed with random flags ";
                util::ToString<unsigned_int>((string *)&local_3c8,&local_58c);
                local_5d0.m_message.px =
                     (element_type *)((ulong)local_5d0.m_message.px & 0xffffffffffffff00);
                local_5d0._0_8_ = &PTR__lazy_ostream_013d8bf0;
                local_5d0.m_message.pn.pi_ = (sp_counted_base *)&local_5f0;
                local_548._8_8_ = local_548._8_8_ & 0xffffffffffffff00;
                local_548._0_8_ = &PTR__lazy_ostream_013d8c30;
                local_538 = (undefined ***)&local_5d0;
                local_530 = ": ";
                local_3f0 = (element_type *)((ulong)local_3f0 & 0xffffffffffffff00);
                local_3f8 = (undefined1  [8])&PTR__lazy_ostream_013d8c70;
                sStack_3e8.pi_ = (sp_counted_base *)local_548;
                local_3e0 = (_Base_ptr)&local_b0;
                local_648 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_640 = "";
                pPVar17 = (PrecomputedTransactionData *)0x1;
                psVar19 = (string *)0x1;
                local_5b8 = &local_3c8;
                boost::test_tools::tt_detail::report_assertion
                          (&local_638,(lazy_ostream *)local_3f8,1,1,WARN,(check_type)pRVar24,
                           (size_t)&local_648,0x10d);
                index_00 = in_stack_fffffffffffff980;
                if ((_Base_ptr *)CONCAT71(local_3c8._1_7_,(undefined1)local_3c8._M_color) !=
                    &local_3c8._M_left) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_3c8._1_7_,(undefined1)local_3c8._M_color),
                                  (ulong)((long)&(local_3c8._M_left)->_M_color + 1));
                  index_00 = in_stack_fffffffffffff980;
                }
                boost::detail::shared_count::~shared_count(&local_638.m_message.pn);
                in_stack_fffffffffffff980 = index_00;
              }
            }
            ExcludeIndividualFlags
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_3f8,flags_00);
            for (p_Var14 = local_3e0; p_Var14 != (_Base_ptr)&local_3f0;
                p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14)) {
              pPVar17 = (PrecomputedTransactionData *)local_388;
              psVar19 = (string *)&local_b0;
              bVar2 = CheckTxScripts((CTransaction *)local_208,
                                     (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                      *)&local_e0,
                                     (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                      *)&local_110,~p_Var14[1]._M_color,pPVar17,psVar19,false);
              if (!bVar2) {
                local_658 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_650 = "";
                local_668 = &boost::unit_test::basic_cstring<char_const>::null;
                local_660 = &boost::unit_test::basic_cstring<char_const>::null;
                file_06.m_end = (iterator)0x114;
                file_06.m_begin = (iterator)&local_658;
                msg_06.m_end = (iterator)psVar19;
                msg_06.m_begin = (iterator)pPVar17;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                           (size_t)&local_668,msg_06);
                local_5f0._0_8_ = local_5f0._0_8_ & 0xffffffffffffff00;
                local_5f0.m_message.px = (element_type *)0x0;
                local_5f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_5d0.m_message.px =
                     (element_type *)((ulong)local_5d0.m_message.px & 0xffffffffffffff00);
                local_5d0._0_8_ = &PTR__lazy_ostream_013d5ea8;
                local_5d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_5b8 = (_Base_ptr)0xf6dbdc;
                local_548._8_8_ = local_548._8_8_ & 0xffffffffffffff00;
                local_548._0_8_ = &PTR__lazy_ostream_013d5e68;
                local_538 = (undefined ***)&local_5d0;
                local_530 = (char *)&local_b0;
                local_678 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_670 = "";
                pPVar17 = (PrecomputedTransactionData *)0x1;
                psVar19 = (string *)0x1;
                boost::test_tools::tt_detail::report_assertion
                          (&local_5f0,(lazy_ostream *)local_548,1,1,WARN,(check_type)pRVar24,
                           (size_t)&local_678,0x114);
                boost::detail::shared_count::~shared_count(&local_5f0.m_message.pn);
              }
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_3f8);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_01);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                   _M_p !=
                &local_258.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
              operator_delete(local_258.super_ValidationState<TxValidationResult>.m_debug_message.
                              _M_dataplus._M_p,
                              CONCAT71(local_258.super_ValidationState<TxValidationResult>.
                                       m_debug_message.field_2._M_allocated_capacity._1_7_,
                                       local_258.super_ValidationState<TxValidationResult>.
                                       m_debug_message.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                   _M_p !=
                &local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
              operator_delete(local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                              _M_dataplus._M_p,
                              (ulong)(local_258.super_ValidationState<TxValidationResult>.
                                      m_reject_reason.field_2._M_allocated_capacity + 1));
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_1f0);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_208);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_4a8)
            ;
            if (local_188 != local_178) {
              operator_delete(local_188,local_178[0] + 1);
            }
          }
          else {
            index = 0;
            uVar15 = 1;
            pcVar21 = (char *)0x1;
            this_00 = pRVar24;
            do {
              pUVar6 = ::UniValue::operator[]((UniValue *)local_168,index);
              bVar2 = false;
              pcVar16 = (char *)0x0;
              if (pUVar6->typ == VARR) {
                pUVar6 = ::UniValue::get_array(pUVar6);
                pcVar16 = (char *)0x0;
                bVar2 = false;
                if (0xfffffffffffffffd <
                    ((long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 5U)
                {
                  pUVar7 = ::UniValue::operator[](pUVar6,0);
                  psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar7);
                  str._M_str = pcVar16;
                  str._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
                  detail::FromHex<uint256>
                            ((optional<uint256> *)local_208,(detail *)psVar8->_M_string_length,str);
                  if ((bool)auStack_1f0[8] != true) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                    goto LAB_0066c6fa;
                  }
                  local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p = (pointer)CONCAT44(local_208._12_4_,local_208._8_4_);
                  local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = CONCAT44(local_208._20_4_,local_208._16_4_);
                  local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = CONCAT44(auStack_1f0._4_4_,auStack_1f0._0_4_);
                  local_258.super_ValidationState<TxValidationResult>.m_mode = local_208._0_4_;
                  local_258.super_ValidationState<TxValidationResult>.m_result = local_208._4_4_;
                  pUVar7 = ::UniValue::operator[](pUVar6,1);
                  local_368 = ::UniValue::getInt<int>(pUVar7);
                  local_378 = (sp_counted_base *)
                              local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                              _M_string_length;
                  pcStack_370 = (char *)local_258.super_ValidationState<TxValidationResult>.
                                        m_reject_reason.field_2._M_allocated_capacity;
                  local_388._0_4_ = local_258.super_ValidationState<TxValidationResult>.m_mode;
                  local_388._4_4_ = local_258.super_ValidationState<TxValidationResult>.m_result;
                  local_388._8_8_ =
                       local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                       _M_dataplus._M_p;
                  pUVar7 = ::UniValue::operator[](pUVar6,2);
                  psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar7);
                  ::ParseScript((CScript *)local_208,psVar8);
                  pmVar9 = std::
                           map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                           ::operator[]((map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                         *)&local_e0,(key_type *)local_388);
                  if (0x1c < (pmVar9->super_CScriptBase)._size) {
                    free((pmVar9->super_CScriptBase)._union.indirect_contents.indirect);
                  }
                  *(ulong *)((long)&(pmVar9->super_CScriptBase)._union + 0xc) =
                       CONCAT44(local_208._16_4_,local_208._12_4_);
                  *(ulong *)((long)&(pmVar9->super_CScriptBase)._union + 0x14) =
                       CONCAT44(auStack_1f0._0_4_,local_208._20_4_);
                  (pmVar9->super_CScriptBase)._union.indirect_contents.indirect =
                       (char *)local_208._0_8_;
                  *(ulong *)((long)&(pmVar9->super_CScriptBase)._union + 8) =
                       CONCAT44(local_208._12_4_,local_208._8_4_);
                  (pmVar9->super_CScriptBase)._size = auStack_1f0._4_4_;
                  if (3 < (ulong)(((long)(pUVar6->values).
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pUVar6->values).
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x2e8ba2e8ba2e8ba3)) {
                    pUVar6 = ::UniValue::operator[](pUVar6,3);
                    lVar10 = ::UniValue::getInt<long>(pUVar6);
                    pmVar11 = std::
                              map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                              ::operator[]((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                            *)&local_110,(key_type *)local_388);
                    *pmVar11 = lVar10;
                  }
                  bVar2 = true;
                  pcVar16 = pcVar21;
                }
              }
            } while ((bVar2) &&
                    (uVar12 = ((long)local_128.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_128.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,
                    bVar2 = uVar15 <= uVar12, lVar10 = uVar12 - uVar15, index = uVar15,
                    uVar15 = (ulong)((int)uVar15 + 1), pcVar21 = pcVar16, bVar2 && lVar10 != 0));
            pRVar24 = this_00;
            if (pcVar16 != (char *)0x0) goto LAB_0066b2e6;
            local_468 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_460 = "";
            local_478 = &boost::unit_test::basic_cstring<char_const>::null;
            local_470 = &boost::unit_test::basic_cstring<char_const>::null;
            file_08.m_end = (iterator)0xec;
            file_08.m_begin = (iterator)&local_468;
            msg_08.m_end = (iterator)psVar19;
            msg_08.m_begin = (iterator)pPVar17;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                       (size_t)&local_478,msg_08);
            local_258.super_ValidationState<TxValidationResult>._0_8_ =
                 local_258.super_ValidationState<TxValidationResult>._0_8_ & 0xffffffffffffff00;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)0x0;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
            ;
            local_208._8_4_ = local_208._8_4_ & 0xffffff00;
            local_208._0_8_ = &PTR__lazy_ostream_013d3800;
            local_208._16_4_ = 0x13e8138;
            local_208._20_4_ = 0;
            auStack_1f0._0_4_ = 0xe87c75;
            auStack_1f0._4_4_ = 0;
            local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
            local_388._0_8_ = &PTR__lazy_ostream_013d3840;
            local_378 = (sp_counted_base *)local_208;
            pcStack_370 = (char *)&local_b0;
            local_488 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_480 = "";
            pPVar17 = (PrecomputedTransactionData *)0x1;
            psVar19 = (string *)0x1;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_258,(lazy_ostream *)local_388,1,1,WARN,
                       (check_type)pRVar24,(size_t)&local_488,0xec);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_string_length);
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_p != &local_150) {
            operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          ::~_Rb_tree(&local_110);
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
          ::~_Rb_tree(&local_e0);
        }
        else {
          local_438 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_430 = "";
          local_448 = &boost::unit_test::basic_cstring<char_const>::null;
          local_440 = &boost::unit_test::basic_cstring<char_const>::null;
          file_07.m_end = (iterator)0xcf;
          file_07.m_begin = (iterator)&local_438;
          msg_07.m_end = (iterator)psVar19;
          msg_07.m_begin = (iterator)pPVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                     (size_t)&local_448,msg_07);
          local_168._0_4_ = local_168._0_4_ & 0xffffff00;
          local_160._M_p = (pointer)0x0;
          sStack_158.pi_ = (sp_counted_base *)0x0;
          local_208._8_4_ = local_208._8_4_ & 0xffffff00;
          local_208._0_8_ = &PTR__lazy_ostream_013d3800;
          local_208._16_4_ = 0x13e8138;
          local_208._20_4_ = 0;
          auStack_1f0._0_4_ = 0xe87c75;
          auStack_1f0._4_4_ = 0;
          local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
          local_388._0_8_ = &PTR__lazy_ostream_013d3840;
          local_378 = (sp_counted_base *)local_208;
          pcStack_370 = (char *)&local_b0;
          local_458 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_450 = "";
          pPVar17 = (PrecomputedTransactionData *)0x1;
          psVar19 = (string *)0x1;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_168,(lazy_ostream *)local_388,1,1,WARN,
                     (check_type)pRVar24,(size_t)&local_458,0xcf);
          boost::detail::shared_count::~shared_count(&sStack_158);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,(ulong)(local_a0._M_allocated_capacity + 1));
      }
      index_00 = (size_t)((int)index_00 + 1);
      uVar15 = ((long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (index_00 <= uVar15 && uVar15 - index_00 != 0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0066c6fa:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_valid)
{
    BOOST_CHECK_MESSAGE(CheckMapFlagNames(), "mapFlagNames is missing a script verification flag");
    // Read tests from test/data/tx_valid.json
    UniValue tests = read_json(json_tests::tx_valid);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test[0].isArray())
        {
            if (test.size() != 3 || !test[1].isStr() || !test[2].isStr())
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::map<COutPoint, CScript> mapprevOutScriptPubKeys;
            std::map<COutPoint, int64_t> mapprevOutValues;
            UniValue inputs = test[0].get_array();
            bool fValid = true;
            for (unsigned int inpIdx = 0; inpIdx < inputs.size(); inpIdx++) {
                const UniValue& input = inputs[inpIdx];
                if (!input.isArray()) {
                    fValid = false;
                    break;
                }
                const UniValue& vinput = input.get_array();
                if (vinput.size() < 3 || vinput.size() > 4)
                {
                    fValid = false;
                    break;
                }
                COutPoint outpoint{Txid::FromHex(vinput[0].get_str()).value(), uint32_t(vinput[1].getInt<int>())};
                mapprevOutScriptPubKeys[outpoint] = ParseScript(vinput[2].get_str());
                if (vinput.size() >= 4)
                {
                    mapprevOutValues[outpoint] = vinput[3].getInt<int64_t>();
                }
            }
            if (!fValid)
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::string transaction = test[1].get_str();
            DataStream stream(ParseHex(transaction));
            CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

            TxValidationState state;
            BOOST_CHECK_MESSAGE(CheckTransaction(tx, state), strTest);
            BOOST_CHECK(state.IsValid());

            PrecomputedTransactionData txdata(tx);
            unsigned int verify_flags = ParseScriptFlags(test[2].get_str());

            // Check that the test gives a valid combination of flags (otherwise VerifyScript will throw). Don't edit the flags.
            if (~verify_flags != FillFlags(~verify_flags)) {
                BOOST_ERROR("Bad test flags: " << strTest);
            }

            BOOST_CHECK_MESSAGE(CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, ~verify_flags, txdata, strTest, /*expect_valid=*/true),
                                "Tx unexpectedly failed: " << strTest);

            // Backwards compatibility of script verification flags: Removing any flag(s) should not invalidate a valid transaction
            for (const auto& [name, flag] : mapFlagNames) {
                // Removing individual flags
                unsigned int flags = TrimFlags(~(verify_flags | flag));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Tx unexpectedly failed with flag " << name << " unset: " << strTest);
                }
                // Removing random combinations of flags
                flags = TrimFlags(~(verify_flags | (unsigned int)m_rng.randbits(mapFlagNames.size())));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Tx unexpectedly failed with random flags " << ToString(flags) << ": " << strTest);
                }
            }

            // Check that flags are maximal: transaction should fail if any unset flags are set.
            for (auto flags_excluding_one : ExcludeIndividualFlags(verify_flags)) {
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, ~flags_excluding_one, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Too many flags unset: " << strTest);
                }
            }
        }
    }
}